

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void luaH_resize(lua_State *L,Table *t,uint newasize,uint nhsize)

{
  lu_byte lVar1;
  byte bVar2;
  Node *block;
  Node *pNVar3;
  uint uVar4;
  TValue *pTVar5;
  lu_byte *plVar6;
  ulong key;
  ulong uVar7;
  Node *old;
  long lVar8;
  Node *value;
  ulong uVar9;
  Table newt;
  Table local_90;
  Node *local_58;
  Node *local_50;
  ulong local_48;
  Value local_40;
  lu_byte local_38;
  
  uVar4 = luaH_realasize(t);
  t->alimit = uVar4;
  t->flags = t->flags & 0x7f;
  setnodevector(L,&local_90,nhsize);
  uVar9 = (ulong)newasize;
  uVar7 = (ulong)uVar4;
  if (newasize < uVar4) {
    t->alimit = newasize;
    lVar1 = t->lsizenode;
    local_50 = t->node;
    local_58 = t->lastfree;
    t->lsizenode = local_90.lsizenode;
    t->node = local_90.node;
    t->lastfree = local_90.lastfree;
    lVar8 = uVar9 << 4;
    key = uVar9;
    local_90.lsizenode = lVar1;
    local_90.node = local_50;
    local_90.lastfree = local_58;
    local_48 = uVar7;
    do {
      key = key + 1;
      if (((&t->array->tt_)[lVar8] & 0xf) != 0) {
        luaH_setint(L,t,key,(TValue *)((long)&t->array->value_ + lVar8));
      }
      lVar8 = lVar8 + 0x10;
    } while (key != uVar7);
    t->alimit = uVar4;
    local_90.lsizenode = t->lsizenode;
    local_90.node = t->node;
    local_90.lastfree = t->lastfree;
    t->lsizenode = lVar1;
    t->node = local_50;
    t->lastfree = local_58;
    uVar7 = local_48;
  }
  pTVar5 = (TValue *)luaM_realloc_(L,t->array,uVar7 << 4,uVar9 << 4);
  if (newasize != 0 && pTVar5 == (TValue *)0x0) {
    luaH_resize();
  }
  bVar2 = t->lsizenode;
  block = t->node;
  pNVar3 = t->lastfree;
  t->lsizenode = local_90.lsizenode;
  t->node = local_90.node;
  t->lastfree = local_90.lastfree;
  t->array = pTVar5;
  t->alimit = newasize;
  if (uVar4 < newasize) {
    lVar8 = uVar9 - uVar7;
    plVar6 = &pTVar5[uVar7].tt_;
    do {
      *plVar6 = '\x10';
      plVar6 = plVar6 + 0x10;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  uVar4 = 1 << (bVar2 & 0x1f);
  local_90.lsizenode = bVar2;
  local_90.node = block;
  local_90.lastfree = pNVar3;
  if (bVar2 != 0x1f) {
    uVar7 = 1;
    if (1 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    value = block;
    do {
      if (((value->u).tt_ & 0xf) != 0) {
        local_40 = (value->u).key_val;
        local_38 = (value->u).key_tt;
        luaH_set(L,t,(TValue *)&local_40,&value->i_val);
      }
      value = value + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  if (pNVar3 != (Node *)0x0) {
    luaM_free_(L,block,(long)(int)uVar4 * 0x18);
    return;
  }
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, unsigned int newasize,
                                          unsigned int nhsize) {
  unsigned int i;
  Table newt;  /* to keep the new hash part */
  unsigned int oldasize = setlimittosize(t);
  TValue *newarray;
  /* create new hash part with appropriate size into 'newt' */
  setnodevector(L, &newt, nhsize);
  if (newasize < oldasize) {  /* will array shrink? */
    t->alimit = newasize;  /* pretend array has new size... */
    exchangehashpart(t, &newt);  /* and new hash */
    /* re-insert into the new hash the elements from vanishing slice */
    for (i = newasize; i < oldasize; i++) {
      if (!isempty(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    t->alimit = oldasize;  /* restore current size... */
    exchangehashpart(t, &newt);  /* and hash (in case of errors) */
  }
  /* allocate new array */
  newarray = luaM_reallocvector(L, t->array, oldasize, newasize, TValue);
  if (l_unlikely(newarray == NULL && newasize > 0)) {  /* allocation failed? */
    freehash(L, &newt);  /* release new hash part */
    luaM_error(L);  /* raise error (with array unchanged) */
  }
  /* allocation ok; initialize new part of the array */
  exchangehashpart(t, &newt);  /* 't' has the new hash ('newt' has the old) */
  t->array = newarray;  /* set new array part */
  t->alimit = newasize;
  for (i = oldasize; i < newasize; i++)  /* clear new slice of the array */
     setempty(&t->array[i]);
  /* re-insert elements from old hash part into new parts */
  reinsert(L, &newt, t);  /* 'newt' now has the old hash */
  freehash(L, &newt);  /* free old hash part */
}